

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O2

int CreateBotDist(DdNode *node,st__table *pathTable,uint *pathLengthArray,FILE *fp)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  DdHalfWord DVar4;
  uint uVar5;
  uint uVar6;
  int *key;
  uint uVar7;
  ulong uVar8;
  NodeDist_t *pNVar9;
  char *__ptr;
  ulong uVar10;
  size_t sStack_70;
  NodeDist_t *nodeStatChild;
  NodeDist_t *nodeStat;
  ulong local_38;
  
  key = (int *)((ulong)node & 0xfffffffffffffffe);
  iVar2 = 1;
  if (*key != 0x7fffffff) {
    iVar2 = st__lookup(pathTable,(char *)key,(char **)&nodeStat);
    if (iVar2 == 0) {
      __ptr = "Something wrong, the entry doesn\'t exist\n";
      sStack_70 = 0x29;
LAB_0062b14c:
      fwrite(__ptr,sStack_70,1,(FILE *)fp);
LAB_0062b15a:
      iVar2 = 0;
    }
    else {
      uVar7 = 0xffffffff;
      uVar5 = uVar7;
      if ((nodeStat->oddTopDist != 0xffffffff) &&
         (uVar5 = nodeStat->oddTopDist + nodeStat->oddBotDist, nodeStat->oddBotDist == 0xffffffff))
      {
        uVar5 = 0xffffffff;
      }
      uVar6 = uVar7;
      if ((nodeStat->evenTopDist != 0xffffffff) &&
         (uVar6 = nodeStat->evenTopDist + nodeStat->evenBotDist, nodeStat->evenBotDist == 0xffffffff
         )) {
        uVar6 = 0xffffffff;
      }
      if (uVar5 < uVar6) {
        uVar6 = uVar5;
      }
      uVar8 = *(ulong *)(key + 4);
      uVar1 = *(ulong *)(key + 6);
      local_38 = (ulong)((uint)node & 1);
      pNVar9 = nodeStat;
      for (iVar2 = 0; (uVar10 = uVar8, iVar2 == 0 || (uVar10 = uVar1, iVar2 != 2));
          iVar2 = iVar2 + 1) {
        if (*(int *)(uVar10 & 0xfffffffffffffffe) == 0x7fffffff) {
          if ((uVar10 & 1) == 0) {
            pNVar9->evenBotDist = 1;
          }
          else {
            pNVar9->oddBotDist = 1;
          }
        }
        else {
          iVar3 = st__lookup(pathTable,(char *)(uVar10 & 0xfffffffffffffffe),(char **)&nodeStatChild
                            );
          if (iVar3 == 0) {
            __ptr = "Something wrong, node in table should have been created in top dist proc.\n";
            sStack_70 = 0x4a;
            goto LAB_0062b14c;
          }
          if (nodeStatChild->oddBotDist == 0xffffffff) {
            if (nodeStatChild->evenBotDist != 0xffffffff) {
              __ptr = "Something wrong, both bot nodeStats should be there\n";
              sStack_70 = 0x34;
              goto LAB_0062b14c;
            }
            iVar3 = CreateBotDist((DdNode *)(local_38 ^ uVar10),pathTable,pathLengthArray,fp);
            if (iVar3 == 0) goto LAB_0062b15a;
          }
          if ((uVar10 & 1) == 0) {
            uVar5 = nodeStatChild->evenBotDist + 1;
            if (uVar5 == 0) {
              uVar5 = uVar7;
            }
            if (uVar5 < nodeStat->evenBotDist) {
              nodeStat->evenBotDist = uVar5;
            }
            DVar4 = nodeStatChild->oddBotDist;
          }
          else {
            uVar5 = nodeStatChild->oddBotDist + 1;
            if (uVar5 == 0) {
              uVar5 = uVar7;
            }
            if (uVar5 < nodeStat->evenBotDist) {
              nodeStat->evenBotDist = uVar5;
            }
            DVar4 = nodeStatChild->evenBotDist;
          }
          uVar5 = DVar4 + 1;
          if (DVar4 + 1 == 0) {
            uVar5 = uVar7;
          }
          pNVar9 = nodeStat;
          if (uVar5 < nodeStat->oddBotDist) {
            nodeStat->oddBotDist = uVar5;
          }
        }
      }
      uVar5 = 0xffffffff;
      uVar8 = 0xffffffff;
      if (pNVar9->oddTopDist != 0xffffffff) {
        uVar7 = pNVar9->oddTopDist + pNVar9->oddBotDist;
        if (pNVar9->oddBotDist == 0xffffffff) {
          uVar7 = 0xffffffff;
        }
        uVar8 = (ulong)uVar7;
      }
      iVar2 = 1;
      if ((pNVar9->evenTopDist != 0xffffffff) &&
         (uVar5 = pNVar9->evenTopDist + pNVar9->evenBotDist, pNVar9->evenBotDist == 0xffffffff)) {
        uVar5 = 0xffffffff;
      }
      if ((uint)uVar8 < uVar6) {
        if (uVar6 != 0xffffffff) {
          pathLengthArray[uVar6] = pathLengthArray[uVar6] - 1;
        }
        pathLengthArray[uVar8] = pathLengthArray[uVar8] + 1;
        uVar6 = (uint)uVar8;
      }
      if (uVar5 < uVar6) {
        if (uVar6 != 0xffffffff) {
          pathLengthArray[uVar6] = pathLengthArray[uVar6] - 1;
        }
        pathLengthArray[uVar5] = pathLengthArray[uVar5] + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
CreateBotDist(
  DdNode * node /* current node */,
  st__table * pathTable /* path table with path lengths */,
  unsigned int * pathLengthArray /* array that stores number of nodes belonging to a particular path length. */,
  FILE *fp /* where to write messages */)
{
    DdNode *N, *Nv, *Nnv;
    DdNode *realChild;
    DdNode *child, *regChild;
    NodeDist_t *nodeStat, *nodeStatChild;
    unsigned int  oddLen, evenLen, pathLength;
    DdHalfWord botDist;
    int processingDone;

    if (Cudd_IsConstant(node))
        return(1);
    N = Cudd_Regular(node);
    /* each node has one table entry */
    /* update as you go down the min dist of each node from
       the root in each (odd and even) parity */
    if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
        fprintf(fp, "Something wrong, the entry doesn't exist\n");
        return(0);
    }

    /* compute length of odd parity distances */
    if ((nodeStat->oddTopDist != MAXSHORTINT) &&
        (nodeStat->oddBotDist != MAXSHORTINT))
        oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
    else
        oddLen = MAXSHORTINT;

    /* compute length of even parity distances */
    if (!((nodeStat->evenTopDist == MAXSHORTINT) ||
          (nodeStat->evenBotDist == MAXSHORTINT)))
        evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
    else
        evenLen = MAXSHORTINT;

    /* assign pathlength to minimum of the two */
    pathLength = (oddLen <= evenLen) ? oddLen : evenLen;

    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    /* process each child */
    processingDone = 0;
    while (processingDone != 2) {
        if (!processingDone) {
            child = Nv;
        } else {
            child = Nnv;
        }

        realChild = Cudd_NotCond(child, Cudd_IsComplement(node));
        regChild = Cudd_Regular(child);
        if (Cudd_IsConstant(realChild)) {
            /* Found a minterm; count parity and shortest distance
            ** from the constant.
            */
            if (Cudd_IsComplement(child))
                nodeStat->oddBotDist = 1;
            else
                nodeStat->evenBotDist = 1;
        } else {
            /* If node not in table, recur. */
            if (! st__lookup(pathTable, (const char *)regChild, (char **)&nodeStatChild)) {
                fprintf(fp, "Something wrong, node in table should have been created in top dist proc.\n");
                return(0);
            }

            if (nodeStatChild->oddBotDist == MAXSHORTINT) {
                if (nodeStatChild->evenBotDist == MAXSHORTINT) {
                    if (!CreateBotDist(realChild, pathTable, pathLengthArray, fp))
                        return(0);
                } else {
                    fprintf(fp, "Something wrong, both bot nodeStats should be there\n");
                    return(0);
                }
            }

            /* Update shortest distance from the constant depending on
            **  parity. */

            if (Cudd_IsComplement(child)) {
                /* If parity on the edge then add 1 to even distance
                ** of child to get odd parity distance and add 1 to
                ** odd distance of child to get even parity
                ** distance. Change distance of current node only if
                ** the calculated distance is less than existing
                ** distance. */
                if (nodeStatChild->oddBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->oddBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->evenBotDist > botDist )
                    nodeStat->evenBotDist = botDist;

                if (nodeStatChild->evenBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->evenBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->oddBotDist > botDist)
                    nodeStat->oddBotDist = botDist;

            } else {
                /* If parity on the edge then add 1 to even distance
                ** of child to get even parity distance and add 1 to
                ** odd distance of child to get odd parity distance.
                ** Change distance of current node only if the
                ** calculated distance is lesser than existing
                ** distance. */
                if (nodeStatChild->evenBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->evenBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->evenBotDist > botDist)
                    nodeStat->evenBotDist = botDist;

                if (nodeStatChild->oddBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->oddBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->oddBotDist > botDist)
                    nodeStat->oddBotDist = botDist;
            }
        } /* end of else (if not constant child ) */
        processingDone++;
    } /* end of while processing Nv, Nnv */

    /* Compute shortest path length on the fly. */
    if ((nodeStat->oddTopDist != MAXSHORTINT) &&
        (nodeStat->oddBotDist != MAXSHORTINT))
        oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
    else
        oddLen = MAXSHORTINT;

    if ((nodeStat->evenTopDist != MAXSHORTINT) &&
        (nodeStat->evenBotDist != MAXSHORTINT))
        evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
    else
        evenLen = MAXSHORTINT;

    /* Update path length array that has number of nodes of a particular
    ** path length. */
    if (oddLen < pathLength ) {
        if (pathLength != MAXSHORTINT)
            pathLengthArray[pathLength]--;
        if (oddLen != MAXSHORTINT)
            pathLengthArray[oddLen]++;
        pathLength = oddLen;
    }
    if (evenLen < pathLength ) {
        if (pathLength != MAXSHORTINT)
            pathLengthArray[pathLength]--;
        if (evenLen != MAXSHORTINT)
            pathLengthArray[evenLen]++;
    }

    return(1);

}